

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

bool __thiscall
clask::server_t::match
          (server_t *this,string *method,string *s,
          function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          *fn)

{
  pointer pcVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  _node *p_Var6;
  bool bVar7;
  _node *p_Var8;
  string sub;
  string ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  node n;
  vector<clask::_node,_std::allocator<clask::_node>_> local_1f8;
  string local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  undefined1 local_198 [24];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  function<void_(clask::response_writer_&,_clask::request_&)> local_160;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
  local_140;
  function<clask::response_(clask::request_&)> local_120;
  bool local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  _Any_data *local_e0;
  long local_d8;
  undefined1 local_d0 [24];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Any_data local_98;
  _Manager_type local_88;
  _Any_data local_78;
  _Manager_type local_68;
  _Any_data local_58;
  _Manager_type local_48;
  bool local_38;
  
  local_e0 = (_Any_data *)fn;
  iVar3 = std::__cxx11::string::compare((char *)method);
  p_Var8 = &this->treeGET;
  if (iVar3 != 0) {
    p_Var8 = &this->treePOST;
  }
  _node::_node((_node *)local_d0,p_Var8);
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = local_1a8;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + s->_M_string_length);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  do {
    lVar4 = std::__cxx11::string::find((char)&local_1b8,0x2f);
    if (lVar4 == -1) {
      std::__cxx11::string::substr((ulong)local_198,(ulong)&local_1b8);
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_198);
      lVar4 = local_1b0;
      if ((_node *)local_198._0_8_ != (_node *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_,
                        (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                        local_198._16_8_)->
                                       super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
        lVar4 = local_1b0;
      }
    }
    else {
      std::__cxx11::string::substr((ulong)local_198,(ulong)&local_1b8);
      std::__cxx11::string::operator=((string *)&local_1d8,(string *)local_198);
      if ((_node *)local_198._0_8_ != (_node *)(local_198 + 0x10)) {
        operator_delete((void *)local_198._0_8_,
                        (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                        local_198._16_8_)->
                                       super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
    uVar5 = local_d0._8_8_;
    if (local_d0._0_8_ == local_d0._8_8_) {
      iVar3 = 3;
    }
    else {
      bVar7 = false;
      p_Var8 = (_node *)local_d0._0_8_;
      local_d8 = lVar4;
      do {
        p_Var6 = p_Var8 + 1;
        if (p_Var8->placeholder == true) {
          url_decode((string *)local_198,&local_1d8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
          ;
          if ((_node *)local_198._0_8_ != (_node *)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,
                            (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                            local_198._16_8_)->
                                           super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          _node::_node((_node *)local_198,p_Var8);
          local_1f8.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_d0._16_8_;
          local_1f8.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_d0._8_8_;
          local_1f8.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_d0._0_8_;
          local_d0._0_8_ = local_198._0_8_;
          local_d0._8_8_ = local_198._8_8_;
          local_d0._16_8_ = local_198._16_8_;
          local_198._0_8_ = (_node *)0x0;
          local_198._8_8_ = (_node *)0x0;
          local_198._16_8_ = (pointer)0x0;
          std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector(&local_1f8);
          std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_180);
          std::function<void_(clask::response_writer_&,_clask::request_&)>::operator=
                    ((function<void_(clask::response_writer_&,_clask::request_&)> *)&local_98,
                     &local_160);
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
          ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
                       *)&local_78,&local_140);
          std::function<clask::response_(clask::request_&)>::operator=
                    ((function<clask::response_(clask::request_&)> *)&local_58,&local_120);
          local_38 = local_100;
          if (local_120.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_120.super__Function_base._M_manager)(&local_120,&local_120,3);
          }
          if (local_140.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_140.super__Function_base._M_manager)(&local_140,&local_140,3);
          }
          if (local_160.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_160.super__Function_base._M_manager)(&local_160,&local_160,3);
          }
LAB_001129f9:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_p != &local_170) {
            operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
          }
          std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector
                    ((vector<clask::_node,_std::allocator<clask::_node>_> *)local_198);
          bVar7 = true;
          bVar2 = true;
        }
        else {
          __n = (p_Var8->name)._M_string_length;
          if ((__n == 0) ||
             ((__n == local_1d8._M_string_length &&
              (iVar3 = bcmp((p_Var8->name)._M_dataplus._M_p,local_1d8._M_dataplus._M_p,__n),
              iVar3 == 0)))) {
            _node::_node((_node *)local_198,p_Var8);
            local_1f8.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_d0._16_8_;
            local_1f8.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_d0._8_8_;
            local_1f8.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_d0._0_8_;
            local_d0._0_8_ = local_198._0_8_;
            local_d0._8_8_ = local_198._8_8_;
            local_d0._16_8_ = local_198._16_8_;
            local_198._0_8_ = (_node *)0x0;
            local_198._8_8_ = (_node *)0x0;
            local_198._16_8_ = (pointer)0x0;
            std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector(&local_1f8);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_180);
            std::function<void_(clask::response_writer_&,_clask::request_&)>::operator=
                      ((function<void_(clask::response_writer_&,_clask::request_&)> *)&local_98,
                       &local_160);
            std::
            function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
            ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&)>
                         *)&local_78,&local_140);
            std::function<clask::response_(clask::request_&)>::operator=
                      ((function<clask::response_(clask::request_&)> *)&local_58,&local_120);
            local_38 = local_100;
            if (local_120.super__Function_base._M_manager != (_Manager_type)0x0) {
              (*local_120.super__Function_base._M_manager)(&local_120,&local_120,3);
            }
            if (local_140.super__Function_base._M_manager != (_Manager_type)0x0) {
              (*local_140.super__Function_base._M_manager)(&local_140,&local_140,3);
            }
            if (local_160.super__Function_base._M_manager != (_Manager_type)0x0) {
              (*local_160.super__Function_base._M_manager)(&local_160,&local_160,3);
            }
            goto LAB_001129f9;
          }
          bVar2 = false;
        }
      } while ((!bVar2) && (p_Var8 = p_Var6, p_Var6 != (_node *)uVar5));
      iVar3 = 3;
      if (bVar7) {
        std::__cxx11::string::substr((ulong)local_198,(ulong)&local_1b8);
        std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_198);
        if ((_node *)local_198._0_8_ != (_node *)(local_198 + 0x10)) {
          operator_delete((void *)local_198._0_8_,
                          (ulong)((long)&(((vector<clask::_node,_std::allocator<clask::_node>_> *)
                                          local_198._16_8_)->
                                         super__Vector_base<clask::_node,_std::allocator<clask::_node>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((local_1b0 == 0) || (iVar3 = 0, local_d0._0_8_ == local_d0._8_8_)) {
          if (*(long *)(local_e0 + 1) == 0) {
            uVar5 = std::__throw_bad_function_call();
            __clang_call_terminate(uVar5);
          }
          iVar3 = 1;
          (**(code **)((long)local_e0 + 0x18))(local_e0,(_func_t *)&local_98,&local_f8);
        }
      }
    }
    if (iVar3 != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,
                        CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                 local_1d8.field_2._M_local_buf[0]) + 1);
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      if (local_48 != (_Manager_type)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_68 != (_Manager_type)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_88 != (_Manager_type)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      std::vector<clask::_node,_std::allocator<clask::_node>_>::~vector
                ((vector<clask::_node,_std::allocator<clask::_node>_> *)local_d0);
      return iVar3 != 3;
    }
  } while( true );
}

Assistant:

inline bool server_t::match(const std::string& method, const std::string& s, const std::function<void(const func_t& fn, const std::vector<std::string>&)>& fn) const {
  node n = method == "GET" ? treeGET : treePOST;
  std::vector<std::string> args;
  auto ss = s;
  std::string sub;
  while (true) {
    auto pos = ss.find('/', 1);

    if (pos == std::string::npos) {
      sub = ss.substr(1);
      pos = ss.size();
    } else {
      sub = ss.substr(1, pos - 1);
    }
    bool found = false;
    for (const auto& vv : n.children) {
      if (vv.placeholder) {
        args.emplace_back(url_decode(sub));
        n = node(vv);
        found = true;
        break;
      } else if (vv.name.empty() || vv.name == sub) {
        n = node(vv);
        found = true;
        break;
      }
    }
    if (!found)
      break;
    ss = ss.substr(pos);
    if (ss.empty() || n.children.empty()) {
      fn(n.fn, args);
      return true;
    }
  }
  return false;
}